

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type __n;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 uVar4;
  pointer puVar5;
  char *pcVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  pointer puVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  char *pcVar14;
  size_t sVar15;
  undefined8 uVar16;
  size_t i;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  pointer puVar20;
  int iVar21;
  ulong uVar22;
  float fVar23;
  string op;
  size_t size_1;
  string arg;
  ggml_type_traits_cpu *qfns_cpu;
  float *test_q1;
  float *test_data1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data1_v;
  ggml_type_traits *qfns;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data2_v;
  float *test_q2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q1_v;
  float *test_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_out_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q2_v;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  size_t local_168;
  char **local_160;
  undefined1 local_158 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_140;
  uint uStack_128;
  undefined4 uStack_124;
  bool bStack_120;
  bool bStack_11f;
  bool bStack_11e;
  bool bStack_11d;
  bool bStack_11c;
  char **local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  ulong local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  long local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  long local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined8 local_70;
  long local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uStack_128 = 0;
  uStack_124 = 0;
  bStack_120 = false;
  bStack_11f = false;
  bStack_11e = false;
  bStack_11d = false;
  bStack_11c = false;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (size_t *)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  local_158._16_8_ = (pointer)0x0;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (size_t *)0x0;
  local_158._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_158._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_118 = (char **)0xa;
  local_110 = &local_100;
  local_108 = (char *)0x0;
  local_100 = 0;
  if (argc < 2) {
LAB_00102ba5:
    local_188._M_unused._M_member_pointer = 0x1000;
    if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (unsigned_long *)
        CONCAT35(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&vStack_140,
                 (iterator)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_188._M_pod_data);
    }
    else {
      *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x1000;
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  else {
    iVar21 = 1;
    local_d0 = 0;
    local_f0 = CONCAT44(local_f0._4_4_,argc);
    local_160 = argv;
    do {
      pcVar6 = local_108;
      pcVar14 = argv[iVar21];
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)&local_110,0,pcVar6,(ulong)pcVar14);
      iVar7 = std::__cxx11::string::compare((char *)&local_110);
      if (iVar7 == 0) {
        iVar21 = iVar21 + 1;
        if (argc <= iVar21) goto LAB_001036b5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_188._M_pod_data,argv[iVar21],(allocator<char> *)&local_88);
        uVar16 = local_188._M_unused._0_8_;
        piVar8 = __errno_location();
        iVar7 = *piVar8;
        *piVar8 = 0;
        puVar10 = (pointer)strtol((char *)uVar16,(char **)&local_c8,10);
        argv = local_160;
        if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)uVar16) {
          std::__throw_invalid_argument("stoi");
        }
        else if (((pointer)0xfffffffeffffffff < puVar10 + -0x80000000) && (*piVar8 != 0x22)) {
          if (*piVar8 == 0) {
            *piVar8 = iVar7;
          }
          if ((code **)local_188._M_unused._0_8_ != &local_178) {
            operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
          }
          argc = (int)local_f0;
          local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = puVar10;
          if (((ulong)puVar10 & 0x1f) == 0) {
            if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                (unsigned_long *)
                CONCAT35(vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._5_3_,
                         vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_5_)) {
              *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)puVar10;
              goto LAB_00102a17;
            }
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&vStack_140,
                       (iterator)
                       vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
            goto LAB_00102a20;
          }
          fprintf(_stderr,"error: size %zu not divisible by 32\n",puVar10);
          goto LAB_001036b5;
        }
        std::__throw_out_of_range("stoi");
LAB_00103701:
        std::__throw_out_of_range("stoi");
LAB_0010370d:
        std::__throw_invalid_argument("stoi");
LAB_00103719:
        std::__throw_out_of_range("stoi");
LAB_00103725:
        uVar16 = std::__throw_invalid_argument("stoi");
        if (local_110 != &local_100) {
          operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
        }
        quantize_perf_params::~quantize_perf_params((quantize_perf_params *)local_158);
        _Unwind_Resume(uVar16);
      }
      iVar7 = std::__cxx11::string::compare((char *)&local_110);
      if (iVar7 == 0) {
        local_188._M_unused._M_member_pointer = 0x1000;
        puVar11 = (unsigned_long *)
                  CONCAT35(vStack_140.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._5_3_,
                           vStack_140.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._0_5_);
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish == puVar11) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_188._M_pod_data);
          puVar11 = (unsigned_long *)
                    CONCAT35(vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                             vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x1000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_188._M_unused._M_member_pointer = 0x10000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish == puVar11) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_188._M_pod_data);
          puVar11 = (unsigned_long *)
                    CONCAT35(vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                             vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0x10000;
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_188._M_unused._M_object = (code **)0xa0000;
        if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish == puVar11) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_188._M_pod_data);
        }
        else {
          *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = 0xa0000;
LAB_00102a17:
          vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_110);
        if (iVar7 == 0) {
          local_188._M_unused._M_member_pointer = 0x1000;
          puVar11 = (unsigned_long *)
                    CONCAT35(vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                             vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
          if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish == puVar11) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&vStack_140,
                       (iterator)
                       vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_long *)local_188._M_pod_data);
            puVar11 = (unsigned_long *)
                      CONCAT35(vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                               vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
          }
          else {
            *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = 0x1000;
            vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_188._M_unused._M_member_pointer = 0x10000;
          if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish == puVar11) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&vStack_140,
                       (iterator)
                       vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_long *)local_188._M_pod_data);
            puVar11 = (unsigned_long *)
                      CONCAT35(vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                               vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
          }
          else {
            *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = 0x10000;
            vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_188._M_unused._M_object = (void *)0xa0000;
          if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish == puVar11) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&vStack_140,
                       (iterator)
                       vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (unsigned_long *)local_188._M_pod_data);
            puVar11 = (unsigned_long *)
                      CONCAT35(vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                               vStack_140.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_);
          }
          else {
            *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = 0xa0000;
            vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_188._M_unused._M_object = (code **)0x3e80000;
          if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar11) {
            *vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = 0x3e80000;
            goto LAB_00102a17;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&vStack_140,
                     (iterator)
                     vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)local_188._M_pod_data);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_110);
          if (iVar7 == 0) {
            iVar21 = iVar21 + 1;
            if (argc <= iVar21) goto LAB_001036b5;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_188._M_pod_data,argv[iVar21],(allocator<char> *)&local_c8);
            iVar7 = std::__cxx11::string::compare(local_188._M_pod_data);
            if (iVar7 == 0) {
              bStack_120 = true;
LAB_00102b4a:
              bVar1 = true;
              bVar2 = false;
            }
            else {
              iVar7 = std::__cxx11::string::compare(local_188._M_pod_data);
              if (iVar7 == 0) {
                bStack_11f = true;
                goto LAB_00102b4a;
              }
              iVar7 = std::__cxx11::string::compare(local_188._M_pod_data);
              if (iVar7 == 0) {
                bStack_11e = true;
                goto LAB_00102b4a;
              }
              iVar7 = std::__cxx11::string::compare(local_188._M_pod_data);
              if (iVar7 == 0) {
                bStack_11d = true;
                goto LAB_00102b4a;
              }
              uVar16 = std::__cxx11::string::compare(local_188._M_pod_data);
              if ((int)uVar16 == 0) {
                bStack_11c = true;
                goto LAB_00102b4a;
              }
              bVar2 = true;
              bVar1 = false;
              local_d0 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
            }
            if ((code **)local_188._M_unused._0_8_ != &local_178) {
              operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
            }
            if (!bVar1) {
              iVar21 = 0;
              if (!bVar2) goto LAB_001035fe;
              break;
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_110);
            if (iVar7 == 0) {
              iVar21 = iVar21 + 1;
              if (argc <= iVar21) goto LAB_001036b5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_188._M_pod_data,argv[iVar21],(allocator<char> *)&local_c8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_188);
              if ((code **)local_188._M_unused._0_8_ != &local_178) {
                operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_110);
              if (iVar7 == 0) {
                iVar21 = iVar21 + 1;
                if (argc <= iVar21) goto LAB_001036b5;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_188._M_pod_data,argv[iVar21],(allocator<char> *)&local_a8
                          );
                uVar16 = local_188._M_unused._0_8_;
                piVar8 = __errno_location();
                iVar7 = *piVar8;
                *piVar8 = 0;
                lVar9 = strtol((char *)uVar16,(char **)&local_c8,10);
                argv = local_160;
                if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == (pointer)uVar16) goto LAB_00103725;
                if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22))
                goto LAB_00103719;
                if (*piVar8 == 0) {
                  *piVar8 = iVar7;
                }
                if ((code **)local_188._M_unused._0_8_ != &local_178) {
                  operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
                }
                if (0x40 < (uint)lVar9) {
                  main_cold_3();
                  goto LAB_001036b5;
                }
                uStack_128 = (uint)lVar9 & 0x7f;
                uStack_124 = 0;
                argc = (int)local_f0;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_110);
                if ((iVar7 != 0) &&
                   (iVar7 = std::__cxx11::string::compare((char *)&local_110), iVar7 != 0)) {
                  iVar21 = std::__cxx11::string::compare((char *)&local_110);
                  if ((iVar21 != 0) &&
                     (iVar21 = std::__cxx11::string::compare((char *)&local_110), iVar21 != 0)) {
                    main_cold_1();
                    goto LAB_001036c2;
                  }
                  iVar21 = 1;
                  usage(argv);
                  goto LAB_001035fe;
                }
                iVar21 = iVar21 + 1;
                if (argc <= iVar21) goto LAB_001036b5;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_188._M_pod_data,argv[iVar21],(allocator<char> *)&local_a8
                          );
                uVar16 = local_188._M_unused._0_8_;
                piVar8 = __errno_location();
                iVar7 = *piVar8;
                *piVar8 = 0;
                lVar9 = strtol((char *)uVar16,(char **)&local_c8,10);
                argv = local_160;
                if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == (pointer)uVar16) goto LAB_0010370d;
                if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22))
                goto LAB_00103701;
                if (*piVar8 == 0) {
                  *piVar8 = iVar7;
                }
                if ((code **)local_188._M_unused._0_8_ != &local_178) {
                  operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
                }
                if (100000000 < (uint)lVar9) {
                  main_cold_2();
                  goto LAB_001036b5;
                }
                local_118 = (char **)(ulong)((uint)lVar9 & 0x7ffffff);
                argc = (int)local_f0;
              }
            }
          }
        }
      }
LAB_00102a20:
      iVar21 = iVar21 + 1;
    } while (iVar21 < argc);
    if ((local_d0 & 1) != 0) {
LAB_001036b5:
      main_cold_4();
LAB_001036c2:
      iVar21 = 1;
      goto LAB_001035fe;
    }
    if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00102ba5;
  }
  puVar20 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((bStack_120 == false) && (bStack_11f == false)) && (bStack_11e == false)) &&
     ((bStack_11d == false && (bStack_11c == false)))) {
    bStack_11c = true;
    bStack_120 = true;
    bStack_11f = true;
    bStack_11e = true;
    bStack_11d = true;
  }
  if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar12 = (long)vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar9 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar5,puVar20);
  }
  uVar12 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  __n = uVar12 * 4 + 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c8,__n,(allocator_type *)local_188._M_pod_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_a8,__n,(allocator_type *)local_188._M_pod_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,__n,(allocator_type *)local_188._M_pod_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,__n,(allocator_type *)local_188._M_pod_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,__n,(allocator_type *)local_188._M_pod_data);
  lVar9 = (long)(int)uStack_128;
  uVar17 = (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x3fU & 0xffffffffffffffc0;
  uVar22 = 0;
  if (0xc0 < uVar17 - (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) {
    uVar17 = uVar22;
  }
  lVar18 = uVar17 + lVar9;
  uVar17 = (ulong)(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
  if (0xc0 < ((ulong)(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
             (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    uVar17 = uVar22;
  }
  uVar19 = (ulong)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
  if (0xc0 < ((ulong)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
             (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    uVar19 = uVar22;
  }
  local_e0 = uVar19 + lVar9;
  uVar19 = (ulong)(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
  if (0xc0 < ((ulong)(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
             (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    uVar19 = uVar22;
  }
  local_90 = uVar19 + lVar9;
  uVar19 = (ulong)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
  if (0xc0 < ((ulong)(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
             (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    uVar19 = uVar22;
  }
  local_68 = uVar19 + lVar9;
  local_d8 = lVar18;
  if (uVar12 != 0) {
    uVar22 = 0;
    do {
      fVar23 = cosf((float)uVar22);
      *(float *)(lVar18 + uVar22 * 4) = fVar23 + fVar23 + 0.1;
      uVar22 = uVar22 + 1;
    } while (uVar12 != uVar22);
    uVar22 = 0;
    do {
      fVar23 = cosf((float)uVar22 + 1.0);
      *(float *)(uVar17 + lVar9 + uVar22 * 4) = fVar23 + fVar23 + 0.1;
      uVar22 = uVar22 + 1;
    } while (uVar12 != uVar22);
  }
  local_160 = local_118;
  local_f0 = uVar12;
  local_d0 = uVar17 + lVar9;
  local_70 = ggml_init();
  iVar21 = 0;
  do {
    local_b0 = ggml_get_type_traits(iVar21);
    local_e8 = (long *)ggml_get_type_traits_cpu(iVar21);
    if ((local_158._0_8_ == local_158._8_8_) ||
       (lVar9 = ggml_type_name(iVar21), uVar4 = local_158._8_8_, uVar16 = local_158._0_8_,
       lVar9 == 0)) {
LAB_00102f03:
      if ((*local_e8 != 0) && (*(long *)(local_b0 + 0x28) != 0)) {
        pcVar14 = (char *)ggml_type_name(iVar21);
        puts(pcVar14);
        ggml_quantize_init(iVar21);
        if (bStack_120 == true) {
          puts("  quantize_row_q_reference");
          puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar20 = vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar20 != puVar5; puVar20 = puVar20 + 1)
          {
            local_168 = *puVar20;
            uVar12 = local_168 * 4;
            if ((long)uVar12 < 0) {
              fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
            }
            else {
              fVar23 = (float)(long)uVar12;
            }
            printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
            sVar15 = ggml_row_size(iVar21,local_168);
            sVar3 = local_168;
            local_188._8_8_ = 0;
            local_188._M_unused._M_object = operator_new(0x20);
            *(long **)local_188._M_unused._0_8_ = &local_b0;
            *(long **)((long)local_188._M_unused._0_8_ + 8) = &local_d8;
            *(long **)((long)local_188._M_unused._0_8_ + 0x10) = &local_e0;
            *(size_t **)((long)local_188._M_unused._0_8_ + 0x18) = &local_168;
            local_170 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:289:40)>
                        ::_M_invoke;
            local_178 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:289:40)>
                        ::_M_manager;
            benchmark_function(sVar3,sVar15,(int64_t)local_160,(function<float_()> *)&local_188);
            if (local_178 != (code *)0x0) {
              (*local_178)(&local_188,&local_188,3);
            }
          }
          putchar(10);
        }
        if (bStack_11f == true) {
          puts("  quantize_row_q");
          puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar20 = vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar20 != puVar5; puVar20 = puVar20 + 1)
          {
            local_168 = *puVar20;
            uVar12 = local_168 * 4;
            if ((long)uVar12 < 0) {
              fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
            }
            else {
              fVar23 = (float)(long)uVar12;
            }
            printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
            sVar15 = ggml_row_size(iVar21,local_168);
            sVar3 = local_168;
            local_188._8_8_ = 0;
            local_188._M_unused._M_object = operator_new(0x20);
            *(long ***)local_188._M_unused._0_8_ = &local_e8;
            *(long **)((long)local_188._M_unused._0_8_ + 8) = &local_d8;
            *(long **)((long)local_188._M_unused._0_8_ + 0x10) = &local_e0;
            *(size_t **)((long)local_188._M_unused._0_8_ + 0x18) = &local_168;
            local_170 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:303:40)>
                        ::_M_invoke;
            local_178 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:303:40)>
                        ::_M_manager;
            benchmark_function(sVar3,sVar15,(int64_t)local_160,(function<float_()> *)&local_188);
            if (local_178 != (code *)0x0) {
              (*local_178)(&local_188,&local_188,3);
            }
          }
          putchar(10);
        }
        if (bStack_11e == true) {
          puts("  dequantize_row_q");
          (*(code *)*local_e8)(local_d8,local_e0,local_f0);
          puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar20 = vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar20 != puVar5; puVar20 = puVar20 + 1)
          {
            local_168 = *puVar20;
            uVar12 = local_168 * 4;
            if ((long)uVar12 < 0) {
              fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
            }
            else {
              fVar23 = (float)(long)uVar12;
            }
            printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
            sVar15 = ggml_row_size(iVar21,local_168);
            sVar3 = local_168;
            local_188._8_8_ = 0;
            local_188._M_unused._M_object = operator_new(0x20);
            *(long **)local_188._M_unused._0_8_ = &local_b0;
            *(long **)((long)local_188._M_unused._0_8_ + 8) = &local_e0;
            *(long **)((long)local_188._M_unused._0_8_ + 0x10) = &local_68;
            *(size_t **)((long)local_188._M_unused._0_8_ + 0x18) = &local_168;
            local_170 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:318:40)>
                        ::_M_invoke;
            local_178 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:318:40)>
                        ::_M_manager;
            benchmark_function(sVar3,sVar15,(int64_t)local_160,(function<float_()> *)&local_188);
            if (local_178 != (code *)0x0) {
              (*local_178)(&local_188,&local_188,3);
            }
          }
          putchar(10);
        }
        if (bStack_11d == true) {
          puts("  quantize_row_q_dot");
          puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar20 = vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar20 != puVar5; puVar20 = puVar20 + 1)
          {
            local_168 = *puVar20;
            uVar12 = local_168 * 4;
            if ((long)uVar12 < 0) {
              fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
            }
            else {
              fVar23 = (float)(long)uVar12;
            }
            printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
            sVar15 = ggml_row_size(iVar21,local_168);
            sVar3 = local_168;
            local_188._8_8_ = 0;
            local_188._M_unused._M_object = operator_new(0x20);
            *(long ***)local_188._M_unused._0_8_ = &local_e8;
            *(long **)((long)local_188._M_unused._0_8_ + 8) = &local_d8;
            *(long **)((long)local_188._M_unused._0_8_ + 0x10) = &local_e0;
            *(size_t **)((long)local_188._M_unused._0_8_ + 0x18) = &local_168;
            local_170 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:332:40)>
                        ::_M_invoke;
            local_178 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:332:40)>
                        ::_M_manager;
            benchmark_function(sVar3,sVar15,(int64_t)local_160,(function<float_()> *)&local_188);
            if (local_178 != (code *)0x0) {
              (*local_178)(&local_188,&local_188,3);
            }
          }
          putchar(10);
        }
        if (bStack_11c == true) {
          puts("  vec_dot_q");
          (*(code *)*local_e8)(local_d8,local_e0,local_f0);
          (*(code *)*local_e8)(local_d0,local_90,local_f0);
          puVar5 = vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar20 = vStack_140.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar20 != puVar5; puVar20 = puVar20 + 1)
          {
            local_168 = *puVar20;
            uVar12 = local_168 * 4;
            if ((long)uVar12 < 0) {
              fVar23 = (float)(uVar12 >> 1) + (float)(uVar12 >> 1);
            }
            else {
              fVar23 = (float)(long)uVar12;
            }
            printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar23 * 9.536743e-07),0));
            sVar15 = ggml_row_size(iVar21,local_168);
            sVar3 = local_168;
            local_188._8_8_ = 0;
            local_188._M_unused._M_object = operator_new(0x20);
            *(long ***)local_188._M_unused._0_8_ = &local_e8;
            *(size_t **)((long)local_188._M_unused._0_8_ + 8) = &local_168;
            *(long **)((long)local_188._M_unused._0_8_ + 0x10) = &local_e0;
            *(long **)((long)local_188._M_unused._0_8_ + 0x18) = &local_90;
            local_170 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:349:40)>
                        ::_M_invoke;
            local_178 = std::
                        _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-quantize-perf.cpp:349:40)>
                        ::_M_manager;
            benchmark_function(sVar3,sVar15,(int64_t)local_160,(function<float_()> *)&local_188);
            if (local_178 != (code *)0x0) {
              (*local_178)(&local_188,&local_188,3);
            }
          }
          putchar(10);
        }
      }
    }
    else {
      local_188._M_unused._0_8_ = (undefined8)ggml_type_name(iVar21);
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         (uVar16,uVar4,&local_188);
      if (_Var13._M_current !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158._8_8_)
      goto LAB_00102f03;
    }
    iVar21 = iVar21 + 1;
  } while (iVar21 != 0x27);
  ggml_free(local_70);
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((code **)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (code **)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar21 = 0;
LAB_001035fe:
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (size_t *)0x0) {
    operator_delete(vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT35(vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_,
                             vStack_140.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_) -
                    (long)vStack_140.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  return iVar21;
}

Assistant:

int main(int argc, char * argv[]) {
    quantize_perf_params params {};

    // read command line

    bool invalid_param = false;
    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "--size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            size_t size = std::stoi(argv[i]);
            if (size % 32 != 0) {
                fprintf(stderr, "error: size %zu not divisible by 32\n", size);
                invalid_param = true;
                break;
            }
            params.test_sizes.push_back(size);
        } else if (arg == "-3") {
            // quick select sizes that probably fit in CPU caches
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
        } else if (arg == "-4") {
            // quick select cache sizes + memory
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
            params.test_sizes.push_back(MEM_SIZE);
        } else if (arg == "--op") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            std::string op {argv[i]};
            if (op == "quantize_row_q_reference") {
                params.op_quantize_row_q_reference = true;
            } else if (op == "quantize_row_q") {
                params.op_quantize_row_q = true;
            } else if (op == "dequantize_row_q") {
                params.op_dequantize_row_q = true;
            } else if (op == "quantize_row_q_dot") {
                params.op_quantize_row_q_dot = true;
            } else if (op == "vec_dot_q") {
                params.op_vec_dot_q = true;
            } else {
                invalid_param = true;
                break;
            }
        } else if (arg == "--type") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.include_types.push_back(argv[i]);
        } else if (arg == "--alignment-offset") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int alignment = std::stoi(argv[i]);
            if (alignment < 0 || alignment > MAX_ALIGNMENT) {
            fprintf(stderr, "error: alignment-offset must be less than %d\n", MAX_ALIGNMENT);
                invalid_param = true;
                break;
            }
            params.alignment_offset = alignment;
        } else if ((arg == "-i") || (arg == "--iterations")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int number = std::stoi(argv[i]);
            if (number < 0 || number > MAX_ITERATIONS) {
            fprintf(stderr, "error: iterations must be less than %d\n", MAX_ITERATIONS);
                invalid_param = true;
                break;
            }
            params.iterations = number;
        } else if ((arg == "-h") || (arg == "--help")) {
            usage(argv);
            return 1;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        return 1;
    }

    if (params.test_sizes.empty()) {
        params.test_sizes.push_back(L1_SIZE);
    }
    if (!(params.op_quantize_row_q_reference || params.op_quantize_row_q || params.op_dequantize_row_q || params.op_quantize_row_q_dot || params.op_vec_dot_q)) {
        params.op_quantize_row_q_reference = params.op_quantize_row_q = params.op_dequantize_row_q = params.op_quantize_row_q_dot = params.op_vec_dot_q = true;
    }

    std::sort(params.test_sizes.begin(), params.test_sizes.end());
    size_t largest = params.test_sizes.back();

    std::vector<uint8_t> test_data1_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_data2_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q1_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q2_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_out_v  (largest*4 + MAX_ALIGNMENT*2);

    float * test_data1 = (float *) align_with_offset(test_data1_v.data(), params.alignment_offset);
    float * test_data2 = (float *) align_with_offset(test_data2_v.data(), params.alignment_offset);
    float * test_q1    = (float *) align_with_offset(test_q1_v.data(),    params.alignment_offset);
    float * test_q2    = (float *) align_with_offset(test_q2_v.data(),    params.alignment_offset);
    float * test_out   = (float *) align_with_offset(test_out_v.data(),   params.alignment_offset);

    generate_data(0, largest, test_data1);
    generate_data(1, largest, test_data2);

    int64_t iterations = params.iterations;


    // Initialize GGML, ensures float conversion tables are initialized
    struct ggml_init_params ggml_params = {
        /* .mem_size   = */ 1*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true,
    };
    struct ggml_context * ctx = ggml_init(ggml_params);

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);
        if (!params.include_types.empty() && ggml_type_name(type) && std::find(params.include_types.begin(), params.include_types.end(), ggml_type_name(type)) == params.include_types.end()) {
            continue;
        }

        if (qfns_cpu->from_float && qfns->to_float) {
            printf("%s\n", ggml_type_name(type));

            ggml_quantize_init(type);

            if (params.op_quantize_row_q_reference) {
                printf("  quantize_row_q_reference\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->from_float_ref(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q) {
                printf("  quantize_row_q\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns_cpu->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_dequantize_row_q) {
                printf("  dequantize_row_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->to_float(test_q1, test_out, size);
                        return test_out[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q_dot) {
                printf("  quantize_row_q_dot\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        const auto * vdot = ggml_get_type_traits_cpu(qfns_cpu->vec_dot_type);
                        vdot->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_vec_dot_q) {
                printf("  vec_dot_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                qfns_cpu->from_float(test_data2, test_q2, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        float result;
                        qfns_cpu->vec_dot(size, &result, 0, test_q1, 0, test_q2, 0, 1);
                        return result;
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }
        }
    }

    ggml_free(ctx);

    return 0;
}